

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-bind-error.c
# Opt level: O2

int run_test_tcp_listen_without_bind(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  char *pcVar3;
  uv_tcp_t server;
  undefined1 auStack_f8 [248];
  
  uVar2 = uv_default_loop();
  iVar1 = uv_tcp_init(uVar2,auStack_f8);
  if (iVar1 == 0) {
    iVar1 = uv_listen(auStack_f8,0x80,0);
    if (iVar1 == 0) {
      loop = (uv_loop_t *)uv_default_loop();
      close_loop(loop);
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (iVar1 == 0) {
        return 0;
      }
      pcVar3 = "0 == uv_loop_close(uv_default_loop())";
      uVar2 = 0xd6;
    }
    else {
      pcVar3 = "r == 0";
      uVar2 = 0xd4;
    }
  }
  else {
    pcVar3 = "r == 0";
    uVar2 = 0xd2;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-bind-error.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(tcp_listen_without_bind) {
  int r;
  uv_tcp_t server;

  r = uv_tcp_init(uv_default_loop(), &server);
  ASSERT(r == 0);
  r = uv_listen((uv_stream_t*)&server, 128, NULL);
  ASSERT(r == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}